

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_info.cpp
# Opt level: O1

string * __thiscall
duckdb::LoadInfo::ToString_abi_cxx11_(string *__return_storage_ptr__,LoadInfo *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  LoadType value;
  pointer pcVar2;
  long *plVar3;
  undefined8 *puVar4;
  InternalException *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  size_type *psVar5;
  string local_d0;
  string local_b0;
  undefined4 *local_90;
  undefined8 local_88;
  undefined4 local_80;
  undefined1 uStack_7c;
  undefined2 uStack_7b;
  undefined1 uStack_79;
  undefined5 uStack_78;
  undefined1 local_73;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,anon_var_dwarf_4f470fa + 9);
  value = this->load_type;
  if (value == FORCE_INSTALL) {
    local_80 = 0x43524f46;
    uStack_7c = 0x45;
    in_RCX = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4c4c4154534e4920
    ;
    uStack_7b = 0x4920;
    uStack_79 = 0x4e;
    uStack_78 = 0x4c4c415453;
    local_88 = 0xd;
    local_73 = 0;
  }
  else if (value == INSTALL) {
    local_80 = 0x54534e49;
    uStack_7c = 0x41;
    uStack_7b = 0x4c4c;
    local_88 = 7;
    uStack_79 = 0;
  }
  else {
    if (value != LOAD) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,"ToString for LoadType with type: %s not implemented","");
      EnumUtil::ToString<duckdb::LoadType>(&local_b0,value);
      InternalException::InternalException<std::__cxx11::string>(this_00,&local_d0,&local_b0);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_80 = 0x44414f4c;
    local_88 = 4;
    uStack_7c = 0;
  }
  local_90 = &local_80;
  ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_90);
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  local_50[0] = local_40;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_50," \'%s\'","");
  pcVar2 = (this->filename)._M_dataplus._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + (this->filename)._M_string_length);
  StringUtil::Format<std::__cxx11::string>(&local_d0,(StringUtil *)local_50,&local_70,in_RCX);
  ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_d0._M_dataplus._M_p)
  ;
  paVar1 = &local_d0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if ((this->repository)._M_string_length != 0) {
    local_d0._M_dataplus._M_p = (pointer)paVar1;
    if (this->repo_is_alias == true) {
      KeywordHelper::WriteOptionallyQuoted(&local_b0,&this->repository,'\"',true);
      plVar3 = (long *)::std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x1e13e98);
      psVar5 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_d0.field_2._M_allocated_capacity = *psVar5;
        local_d0.field_2._8_8_ = plVar3[3];
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar5;
        local_d0._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_d0._M_string_length = plVar3[1];
      *plVar3 = (long)psVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_d0._M_dataplus._M_p);
    }
    else {
      KeywordHelper::WriteQuoted(&local_b0,&this->repository,'\'');
      puVar4 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x1e13e98);
      psVar5 = puVar4 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_d0.field_2._M_allocated_capacity = *psVar5;
        local_d0.field_2._8_8_ = puVar4[3];
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar5;
        local_d0._M_dataplus._M_p = (pointer)*puVar4;
      }
      local_d0._M_string_length = puVar4[1];
      *puVar4 = psVar5;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string LoadInfo::ToString() const {
	string result = "";
	result += LoadInfoToString(load_type);
	result += StringUtil::Format(" '%s'", filename);
	if (!repository.empty()) {
		if (repo_is_alias) {
			result += " FROM " + KeywordHelper::WriteOptionallyQuoted(repository);
		} else {
			result += " FROM " + KeywordHelper::WriteQuoted(repository);
		}
	}

	result += ";";
	return result;
}